

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O0

int update_arg(void *field,char **orig_field,uint *field_given,uint *prev_given,char *value,
              char **possible_values,char *default_value,cmdline_parser_arg_type arg_type,
              int check_ambiguity,int override,int no_free,int multiple_option,char *long_opt,
              char short_opt,char *additional_error)

{
  char *pcVar1;
  long lVar2;
  int *in_RCX;
  int *in_RDX;
  long *in_RSI;
  double *in_RDI;
  char *in_R8;
  long in_R9;
  double dVar3;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  undefined8 in_stack_00000038;
  char in_stack_00000040;
  char *in_stack_00000048;
  char **string_field;
  int found;
  char *val;
  char *stop_char;
  char *in_stack_fffffffffffffed8;
  char **in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  char *local_e0;
  char *local_a0;
  char *local_80;
  int local_4c;
  char *local_48;
  char *local_40;
  long local_38;
  char *local_30;
  int *local_28;
  int *local_20;
  long *local_18;
  double *local_10;
  int local_4;
  
  local_40 = (char *)0x0;
  local_4c = 0;
  if (((in_stack_00000030 == 0) && (in_RCX != (int *)0x0)) &&
     ((*in_RCX != 0 || ((in_stack_00000018 != 0 && (*in_RDX != 0)))))) {
    if (in_stack_00000040 == '-') {
      if (in_stack_00000048 == (char *)0x0) {
        local_a0 = "";
      }
      else {
        local_a0 = in_stack_00000048;
      }
      fprintf(_stderr,"%s: `--%s\' option given more than once%s\n",package_name,in_stack_00000038,
              local_a0);
    }
    else {
      if (in_stack_00000048 == (char *)0x0) {
        local_80 = "";
      }
      else {
        local_80 = in_stack_00000048;
      }
      fprintf(_stderr,"%s: `--%s\' (`-%c\') option given more than once%s\n",package_name,
              in_stack_00000038,(ulong)(uint)(int)in_stack_00000040,local_80);
    }
    local_4 = 1;
  }
  else {
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if ((in_R9 != 0) &&
       (local_4c = check_possible_values(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0),
       local_4c < 0)) {
      if (in_stack_00000040 == '-') {
        pcVar1 = "invalid";
        if (local_4c == -2) {
          pcVar1 = "ambiguous";
        }
        if (in_stack_00000048 == (char *)0x0) {
          in_stack_00000048 = "";
        }
        fprintf(_stderr,"%s: %s argument, \"%s\", for option `--%s\'%s\n",package_name,pcVar1,
                local_30,in_stack_00000038,in_stack_00000048);
      }
      else {
        pcVar1 = "invalid";
        if (local_4c == -2) {
          pcVar1 = "ambiguous";
        }
        if (in_stack_00000048 == (char *)0x0) {
          local_e0 = "";
        }
        else {
          local_e0 = in_stack_00000048;
        }
        fprintf(_stderr,"%s: %s argument, \"%s\", for option `--%s\' (`-%c\')%s\n",package_name,
                pcVar1,local_30,in_stack_00000038,
                CONCAT44((int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_00000040),
                local_e0);
      }
      return 1;
    }
    if (((local_20 == (int *)0x0) || (*local_20 == 0)) || (in_stack_00000020 != 0)) {
      if (local_28 != (int *)0x0) {
        *local_28 = *local_28 + 1;
      }
      if (local_20 != (int *)0x0) {
        *local_20 = *local_20 + 1;
      }
      local_48 = in_R8;
      if (local_38 != 0) {
        local_48 = *(char **)(local_38 + (long)local_4c * 8);
      }
      switch(in_stack_00000010) {
      case 1:
        if (local_48 != (char *)0x0) {
          if ((in_stack_00000028 == 0) && (*local_10 != 0.0)) {
            free((void *)*local_10);
          }
          pcVar1 = gengetopt_strdup(in_stack_fffffffffffffed8);
          *local_10 = (double)pcVar1;
        }
        break;
      case 2:
        if (local_48 != (char *)0x0) {
          lVar2 = strtol(local_48,&local_40,0);
          *(int *)local_10 = (int)lVar2;
        }
        break;
      case 3:
        if (local_48 != (char *)0x0) {
          dVar3 = strtod(local_48,&local_40);
          *local_10 = dVar3;
        }
        break;
      case 4:
        if (local_48 != (char *)0x0) {
          *(int *)local_10 = local_4c;
        }
      }
      if (((in_stack_00000010 == 2 || in_stack_00000010 == 3) && (local_48 != (char *)0x0)) &&
         ((local_40 == (char *)0x0 || (*local_40 != '\0')))) {
        fprintf(_stderr,"%s: invalid numeric value: %s\n",package_name,local_48);
        local_4 = 1;
      }
      else {
        if (((in_stack_00000010 != 0) && (local_30 != (char *)0x0)) && (local_18 != (long *)0x0)) {
          if (in_stack_00000028 == 0) {
            if (*local_18 != 0) {
              free((void *)*local_18);
            }
            pcVar1 = gengetopt_strdup(in_stack_fffffffffffffed8);
            *local_18 = (long)pcVar1;
          }
          else {
            *local_18 = (long)local_30;
          }
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static
int update_arg(void *field, char **orig_field,
               unsigned int *field_given, unsigned int *prev_given, 
               char *value, const char *possible_values[],
               const char *default_value,
               cmdline_parser_arg_type arg_type,
               int check_ambiguity, int override,
               int no_free, int multiple_option,
               const char *long_opt, char short_opt,
               const char *additional_error)
{
  char *stop_char = 0;
  const char *val = value;
  int found;
  char **string_field;
  FIX_UNUSED (field);

  stop_char = 0;
  found = 0;

  if (!multiple_option && prev_given && (*prev_given || (check_ambiguity && *field_given)))
    {
      if (short_opt != '-')
        fprintf (stderr, "%s: `--%s' (`-%c') option given more than once%s\n", 
               package_name, long_opt, short_opt,
               (additional_error ? additional_error : ""));
      else
        fprintf (stderr, "%s: `--%s' option given more than once%s\n", 
               package_name, long_opt,
               (additional_error ? additional_error : ""));
      return 1; /* failure */
    }

  if (possible_values && (found = check_possible_values((value ? value : default_value), possible_values)) < 0)
    {
      if (short_opt != '-')
        fprintf (stderr, "%s: %s argument, \"%s\", for option `--%s' (`-%c')%s\n", 
          package_name, (found == -2) ? "ambiguous" : "invalid", value, long_opt, short_opt,
          (additional_error ? additional_error : ""));
      else
        fprintf (stderr, "%s: %s argument, \"%s\", for option `--%s'%s\n", 
          package_name, (found == -2) ? "ambiguous" : "invalid", value, long_opt,
          (additional_error ? additional_error : ""));
      return 1; /* failure */
    }
    
  if (field_given && *field_given && ! override)
    return 0;
  if (prev_given)
    (*prev_given)++;
  if (field_given)
    (*field_given)++;
  if (possible_values)
    val = possible_values[found];

  switch(arg_type) {
  case ARG_INT:
    if (val) *((int *)field) = strtol (val, &stop_char, 0);
    break;
  case ARG_DOUBLE:
    if (val) *((double *)field) = strtod (val, &stop_char);
    break;
  case ARG_ENUM:
    if (val) *((int *)field) = found;
    break;
  case ARG_STRING:
    if (val) {
      string_field = (char **)field;
      if (!no_free && *string_field)
        free (*string_field); /* free previous string */
      *string_field = gengetopt_strdup (val);
    }
    break;
  default:
    break;
  };

  /* check numeric conversion */
  switch(arg_type) {
  case ARG_INT:
  case ARG_DOUBLE:
    if (val && !(stop_char && *stop_char == '\0')) {
      fprintf(stderr, "%s: invalid numeric value: %s\n", package_name, val);
      return 1; /* failure */
    }
    break;
  default:
    ;
  };

  /* store the original value */
  switch(arg_type) {
  case ARG_NO:
    break;
  default:
    if (value && orig_field) {
      if (no_free) {
        *orig_field = value;
      } else {
        if (*orig_field)
          free (*orig_field); /* free previous string */
        *orig_field = gengetopt_strdup (value);
      }
    }
  };

  return 0; /* OK */
}